

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-light.c
# Opt level: O0

_Bool borg_check_light(void)

{
  wchar_t wVar1;
  wchar_t wVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  int local_24;
  int local_20;
  int x;
  int y;
  _Bool do_obj;
  _Bool do_evil;
  _Bool do_wall;
  _Bool do_door;
  _Bool do_trap;
  int q_y;
  int q_x;
  
  wVar2 = w_x;
  if ((borg.trait[0x24] < 0xb) || (borg.trait[0x69] != 0)) {
    if ((borg.trait[0x70] == 0) &&
       ((((borg.trait[0x72] == 0 && (borg.trait[0x78] == 0)) && (borg.trait[0x73] == 0)) &&
        ((borg.trait[0x74] == 0 && (borg.trait[0x6c] == 0)))))) {
      iVar4 = borg_panel_wid();
      wVar1 = w_y;
      iVar4 = wVar2 / iVar4;
      iVar5 = borg_panel_hgt();
      iVar5 = wVar1 / iVar5;
      y._3_1_ = (borg_detect_trap[iVar5][iVar4 + 1] & 1U) == 0 ||
                (borg_detect_trap[iVar5][iVar4] & 1U) == 0;
      if ((borg_detect_trap[iVar5 + 1][iVar4] & 1U) == 0) {
        y._3_1_ = true;
      }
      if ((borg_detect_trap[iVar5 + 1][iVar4 + 1] & 1U) == 0) {
        y._3_1_ = true;
      }
      y._2_1_ = (borg_detect_door[iVar5][iVar4 + 1] & 1U) == 0 ||
                (borg_detect_door[iVar5][iVar4] & 1U) == 0;
      if ((borg_detect_door[iVar5 + 1][iVar4] & 1U) == 0) {
        y._2_1_ = true;
      }
      if ((borg_detect_door[iVar5 + 1][iVar4 + 1] & 1U) == 0) {
        y._2_1_ = true;
      }
      y._1_1_ = (borg_detect_wall[iVar5][iVar4 + 1] & 1U) == 0 ||
                (borg_detect_wall[iVar5][iVar4] & 1U) == 0;
      if ((borg_detect_wall[iVar5 + 1][iVar4] & 1U) == 0) {
        y._1_1_ = true;
      }
      if ((borg_detect_wall[iVar5 + 1][iVar4 + 1] & 1U) == 0) {
        y._1_1_ = true;
      }
      y._0_1_ = (borg_detect_evil[iVar5][iVar4 + 1] & 1U) == 0 ||
                (borg_detect_evil[iVar5][iVar4] & 1U) == 0;
      if ((borg_detect_evil[iVar5 + 1][iVar4] & 1U) == 0) {
        y._0_1_ = true;
      }
      if ((borg_detect_evil[iVar5 + 1][iVar4 + 1] & 1U) == 0) {
        y._0_1_ = true;
      }
      x._3_1_ = (borg_detect_obj[iVar5][iVar4 + 1] & 1U) == 0 ||
                (borg_detect_obj[iVar5][iVar4] & 1U) == 0;
      if ((borg_detect_obj[iVar5 + 1][iVar4] & 1U) == 0) {
        x._3_1_ = true;
      }
      if ((borg_detect_obj[iVar5 + 1][iVar4 + 1] & 1U) == 0) {
        x._3_1_ = true;
      }
      if (borg.trait[0x25] != 0) {
        y._0_1_ = false;
      }
      if (borg.trait[0x69] == 0) {
        y._3_1_ = false;
        y._2_1_ = false;
        y._1_1_ = false;
      }
      if (((((y._3_1_) || (y._2_1_)) || (y._0_1_)) &&
          ((((borg.when_detect_traps == 0 || (4 < (int)borg_t - (int)borg.when_detect_traps)) ||
            (borg.when_detect_evil == 0)) ||
           (((4 < (int)borg_t - (int)borg.when_detect_evil || (borg.when_detect_doors == 0)) ||
            (4 < (int)borg_t - (int)borg.when_detect_doors)))))) &&
         ((borg.trait[0x69] != 0 &&
          (((_Var3 = borg_activate_item(act_detect_all), _Var3 ||
            (_Var3 = borg_activate_item(act_mapping), _Var3)) ||
           ((_Var3 = borg_zap_rod(sv_rod_detection), _Var3 ||
            (_Var3 = borg_spell_fail(SENSE_SURROUNDINGS,0x28), _Var3)))))))) {
        borg_note("# Checking for traps, doors, and evil.");
        borg_react("SELF:TDE","SELF:TDE");
        borg.when_detect_traps = borg_t;
        borg.when_detect_doors = borg_t;
        borg.when_detect_evil = borg_t;
        borg.when_detect_obj = borg_t;
        q_y._3_1_ = true;
      }
      else if ((y._0_1_) &&
              (((borg.when_detect_evil == 0 || (0x13 < (int)borg_t - (int)borg.when_detect_evil)) &&
               ((_Var3 = borg_spell_fail(DETECT_EVIL,0x28), _Var3 ||
                (((_Var3 = borg_spell_fail(DETECT_MONSTERS,0x28), _Var3 ||
                  (_Var3 = borg_spell_fail(READ_MINDS,0x28), _Var3)) ||
                 (_Var3 = borg_spell_fail(SEEK_BATTLE,0x28), _Var3)))))))) {
        borg_note("# Checking for monsters.");
        borg_react("SELF:evil","SELF:evil");
        borg.when_detect_evil = borg_t;
        q_y._3_1_ = true;
      }
      else if (((y._3_1_) || (y._2_1_)) &&
              (((borg.when_detect_traps == 0 ||
                (((4 < (int)borg_t - (int)borg.when_detect_traps || (borg.when_detect_doors == 0))
                 || (4 < (int)borg_t - (int)borg.when_detect_doors)))) &&
               ((borg.trait[0x69] != 0 &&
                ((((_Var3 = borg_activate_item(act_detect_all), _Var3 ||
                   (_Var3 = borg_activate_item(act_mapping), _Var3)) ||
                  (_Var3 = borg_spell_fail(DETECTION,0x28), _Var3)) ||
                 ((_Var3 = borg_spell_fail(FIND_TRAPS_DOORS_STAIRS,0x28), _Var3 ||
                  (_Var3 = borg_spell_fail(DETECT_STAIRS,0x28), _Var3)))))))))) {
        borg_note("# Checking for traps, doors & stairs.");
        borg_react("SELF:both","SELF:both");
        borg.when_detect_traps = borg_t;
        borg.when_detect_doors = borg_t;
        q_y._3_1_ = true;
      }
      else if (((y._3_1_) &&
               ((borg.when_detect_traps == 0 || (6 < (int)borg_t - (int)borg.when_detect_traps))))
              && ((borg.trait[0x69] != 0 &&
                  ((_Var3 = borg_spell_fail(DETECTION,0x28), _Var3 ||
                   (_Var3 = borg_spell_fail(FIND_TRAPS_DOORS_STAIRS,0x28), _Var3)))))) {
        borg_note("# Checking for traps.");
        borg_react("SELF:trap","SELF:trap");
        borg.when_detect_traps = borg_t;
        q_y._3_1_ = true;
      }
      else if ((y._2_1_) &&
              ((((borg.when_detect_doors == 0 || (8 < (int)borg_t - (int)borg.when_detect_doors)) &&
                (borg.trait[0x69] != 0)) &&
               (((_Var3 = borg_activate_item(act_detect_all), _Var3 ||
                 (_Var3 = borg_activate_item(act_mapping), _Var3)) ||
                ((_Var3 = borg_spell_fail(DETECTION,0x28), _Var3 ||
                 (_Var3 = borg_spell_fail(FIND_TRAPS_DOORS_STAIRS,0x28), _Var3)))))))) {
        borg_note("# Checking for doors.");
        borg_react("SELF:door","SELF:door");
        borg.when_detect_doors = borg_t;
        q_y._3_1_ = true;
      }
      else if ((y._1_1_) &&
              ((((borg.when_detect_walls == 0 || (0xe < (int)borg_t - (int)borg.when_detect_walls))
                && (borg.trait[0x69] != 0)) &&
               ((((_Var3 = borg_activate_item(act_mapping), _Var3 ||
                  (_Var3 = borg_read_scroll(sv_scroll_mapping), _Var3)) ||
                 (_Var3 = borg_use_staff(sv_staff_mapping), _Var3)) ||
                ((_Var3 = borg_zap_rod(sv_rod_mapping), _Var3 ||
                 (_Var3 = borg_spell(SENSE_SURROUNDINGS), _Var3)))))))) {
        borg_note("# Checking for walls.");
        borg_react("SELF:wall","SELF:wall");
        borg.when_detect_walls = borg_t;
        for (local_20 = 0; local_20 < 0x42; local_20 = local_20 + 1) {
          for (local_24 = 0; local_24 < 0xc6; local_24 = local_24 + 1) {
            borg_grids[local_20][local_24].info = borg_grids[local_20][local_24].info & 0xfeff;
          }
        }
        q_y._3_1_ = true;
      }
      else if (((x._3_1_) &&
               ((borg.when_detect_obj == 0 || (0x13 < (int)borg_t - (int)borg.when_detect_obj)))) &&
              ((_Var3 = borg_activate_item(act_detect_objects), _Var3 ||
               (_Var3 = borg_spell_fail(OBJECT_DETECTION,0x28), _Var3)))) {
        borg_note("# Checking for objects.");
        borg_react("SELF:obj","SELF:obj");
        borg.when_detect_obj = borg_t;
        q_y._3_1_ = true;
      }
      else {
        q_y._3_1_ = borg_check_light_only();
      }
    }
    else {
      q_y._3_1_ = false;
    }
  }
  else {
    q_y._3_1_ = false;
  }
  return q_y._3_1_;
}

Assistant:

bool borg_check_light(void)
{
    int q_x, q_y;

    bool do_trap;
    bool do_door;
    bool do_wall;
    bool do_evil;
    bool do_obj;

    /* Never in town when mature (scary guy)*/
    if (borg.trait[BI_MAXCLEVEL] > 10 && !borg.trait[BI_CDEPTH])
        return false;

    /* Never when compromised, save your mana */
    if (borg.trait[BI_ISBLIND] 
        || borg.trait[BI_ISCONFUSED]
        || borg.trait[BI_ISIMAGE] 
        || borg.trait[BI_ISPOISONED]
        || borg.trait[BI_ISCUT] 
        || borg.trait[BI_ISWEAK])
        return false;

    /* XXX XXX XXX Dark */

    /* Extract the panel */
    q_x = w_x / borg_panel_wid();
    q_y = w_y / borg_panel_hgt();

    /* Start */
    do_trap = false;

    /* Determine if we need to detect traps */
    if (!borg_detect_trap[q_y + 0][q_x + 0])
        do_trap = true;
    if (!borg_detect_trap[q_y + 0][q_x + 1])
        do_trap = true;
    if (!borg_detect_trap[q_y + 1][q_x + 0])
        do_trap = true;
    if (!borg_detect_trap[q_y + 1][q_x + 1])
        do_trap = true;

    /* Hack -- check traps every few turns anyway */
    /* if (!when_detect_traps || (borg_t - when_detect_traps >= 183)) do_trap =
     * true; */

    /* Start */
    do_door = false;

    /* Determine if we need to detect doors */
    if (!borg_detect_door[q_y + 0][q_x + 0])
        do_door = true;
    if (!borg_detect_door[q_y + 0][q_x + 1])
        do_door = true;
    if (!borg_detect_door[q_y + 1][q_x + 0])
        do_door = true;
    if (!borg_detect_door[q_y + 1][q_x + 1])
        do_door = true;

    /* Hack -- check doors every few turns anyway */
    /* if (!when_detect_doors || (borg_t - when_detect_doors >= 731)) do_door =
     * true; */

    /* Start */
    do_wall = false;

    /* Determine if we need to detect walls */
    if (!borg_detect_wall[q_y + 0][q_x + 0])
        do_wall = true;
    if (!borg_detect_wall[q_y + 0][q_x + 1])
        do_wall = true;
    if (!borg_detect_wall[q_y + 1][q_x + 0])
        do_wall = true;
    if (!borg_detect_wall[q_y + 1][q_x + 1])
        do_wall = true;

    /* Hack -- check walls every few turns anyway */
    /* if (!when_detect_walls || (borg_t - when_detect_walls >= 937)) do_wall =
     * true; */

    /* Start */
    do_evil = false;

    /* Determine if we need to detect evil */
    if (!borg_detect_evil[q_y + 0][q_x + 0])
        do_evil = true;
    if (!borg_detect_evil[q_y + 0][q_x + 1])
        do_evil = true;
    if (!borg_detect_evil[q_y + 1][q_x + 0])
        do_evil = true;
    if (!borg_detect_evil[q_y + 1][q_x + 1])
        do_evil = true;

    /* Start */
    do_obj = false;

    /* Determine if we need to detect evil */
    if (!borg_detect_obj[q_y + 0][q_x + 0])
        do_obj = true;
    if (!borg_detect_obj[q_y + 0][q_x + 1])
        do_obj = true;
    if (!borg_detect_obj[q_y + 1][q_x + 0])
        do_obj = true;
    if (!borg_detect_obj[q_y + 1][q_x + 1])
        do_obj = true;

    /* Hack -- check evil every few turns anyway- more fq if low level */
    /* if (!when_detect_evil ||
       (borg_t - when_detect_evil  >= 183 - (80 - borg.trait[BI_MAXCLEVEL])))
       do_evil = true; */

    /* Really low level */
    /* if (borg.trait[BI_CLEVEL] <= 3 &&
        (!when_detect_evil ||
        (borg_t - when_detect_evil  >= 50))) do_evil = true; */

    /* Not too frequent in town */
    /* if (borg.trait[BI_CDEPTH] == 0 &&
        (!when_detect_evil ||
        (borg_t - when_detect_evil  >= 250))) do_evil = true; */

    /* Dont bother if I have ESP */
    if (borg.trait[BI_ESP])
        do_evil = false;

    /* Only look for monsters in town, not walls, etc (scary guy)*/
    if (!borg.trait[BI_CDEPTH]) {
        do_trap = false;
        do_door = false;
        do_wall = false;
    }

    /*** Do Things ***/

    /* Hack -- find traps and doors and evil*/
    if ((do_trap || do_door || do_evil)
        && ((!borg.when_detect_traps || (borg_t - borg.when_detect_traps >= 5))
            || (!borg.when_detect_evil || (borg_t - borg.when_detect_evil >= 5))
            || (!borg.when_detect_doors
                || (borg_t - borg.when_detect_doors >= 5)))
        && borg.trait[BI_CDEPTH]) /* Never in town */
    {

        /* Check for traps and doors and evil*/
        if (borg_activate_item(act_detect_all)
            || borg_activate_item(act_mapping) 
            || borg_zap_rod(sv_rod_detection)
            || borg_spell_fail(SENSE_SURROUNDINGS, 40)) {
            borg_note("# Checking for traps, doors, and evil.");

            borg_react("SELF:TDE", "SELF:TDE");

            borg.when_detect_traps = borg_t;
            borg.when_detect_doors = borg_t;
            borg.when_detect_evil  = borg_t;
            borg.when_detect_obj   = borg_t;

            return true;
        }
    }

    /* Hack -- find evil */
    if (do_evil
        && (!borg.when_detect_evil || (borg_t - borg.when_detect_evil >= 20))) {
        /* Check for evil */
        if (borg_spell_fail(DETECT_EVIL, 40)
            || borg_spell_fail(DETECT_MONSTERS, 40)
            || borg_spell_fail(READ_MINDS, 40)
            || borg_spell_fail(SEEK_BATTLE, 40)) {
            borg_note("# Checking for monsters.");

            borg_react("SELF:evil", "SELF:evil");

            borg.when_detect_evil = borg_t;

            return true;
        }
    }

    /* Hack -- find traps and doors (and stairs) */
    if ((do_trap || do_door)
        && ((!borg.when_detect_traps || (borg_t - borg.when_detect_traps >= 5))
            || (!borg.when_detect_doors
                || (borg_t - borg.when_detect_doors >= 5)))
        && borg.trait[BI_CDEPTH]) /* Never in town */
    {
        /* Check for traps and doors */
        if (borg_activate_item(act_detect_all)
            || borg_activate_item(act_mapping) 
            || borg_spell_fail(DETECTION, 40)
            || borg_spell_fail(FIND_TRAPS_DOORS_STAIRS, 40)
            || borg_spell_fail(DETECT_STAIRS, 40)) {
            borg_note("# Checking for traps, doors & stairs.");

            borg_react("SELF:both", "SELF:both");

            borg.when_detect_traps = borg_t;
            borg.when_detect_doors = borg_t;

            return true;
        }
    }

    /* Hack -- find traps */
    if (do_trap
        && (!borg.when_detect_traps || (borg_t - borg.when_detect_traps >= 7))
        && borg.trait[BI_CDEPTH]) /* Never in town */
    {
        /* Check for traps */
        if (borg_spell_fail(DETECTION, 40)
            || borg_spell_fail(FIND_TRAPS_DOORS_STAIRS, 40)) {
            borg_note("# Checking for traps.");

            borg_react("SELF:trap", "SELF:trap");

            borg.when_detect_traps = borg_t;

            return true;
        }
    }

    /* Hack -- find doors */
    if (do_door
        && (!borg.when_detect_doors || (borg_t - borg.when_detect_doors >= 9))
        && borg.trait[BI_CDEPTH]) /* Never in town */
    {
        /* Check for traps */
        if (borg_activate_item(act_detect_all)
            || borg_activate_item(act_mapping) || borg_spell_fail(DETECTION, 40)
            || borg_spell_fail(FIND_TRAPS_DOORS_STAIRS, 40)) {
            borg_note("# Checking for doors.");

            borg_react("SELF:door", "SELF:door");

            borg.when_detect_doors = borg_t;

            return true;
        }
    }

    /* Hack -- find walls */
    if (do_wall
        && (!borg.when_detect_walls || (borg_t - borg.when_detect_walls >= 15))
        /* Never in town */
        && borg.trait[BI_CDEPTH]) {
        /* Check for walls */
        if (borg_activate_item(act_mapping)
            || borg_read_scroll(sv_scroll_mapping)
            || borg_use_staff(sv_staff_mapping) || borg_zap_rod(sv_rod_mapping)
            || borg_spell(SENSE_SURROUNDINGS)) {
            int y, x;

            borg_note("# Checking for walls.");

            borg_react("SELF:wall", "SELF:wall");

            borg.when_detect_walls = borg_t;

            /*
             * Clear the BORG_IGNORE_MAP flag:  immediately after detection
             * want to use the map's information rather than what the borg
             * remembers.
             */
            for (y = 0; y < AUTO_MAX_Y; ++y) {
                for (x = 0; x < AUTO_MAX_X; ++x) {
                    borg_grids[y][x].info &= ~BORG_IGNORE_MAP;
                }
            }
            return true;
        }
    }

    /* Hack -- find objects */
    if (do_obj
        && (!borg.when_detect_obj || (borg_t - borg.when_detect_obj >= 20))) {
        /* Check for objects */
        if (borg_activate_item(act_detect_objects)
            || borg_spell_fail(OBJECT_DETECTION, 40)) {
            borg_note("# Checking for objects.");

            borg_react("SELF:obj", "SELF:obj");

            borg.when_detect_obj = borg_t;

            return true;
        }
    }

    /* Do the actual illumination bit */
    return borg_check_light_only();
}